

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

ostream * operator<<(ostream *ostream,Socket *socket)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*(socket->super_stream)._vptr_stream[1])(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return ostream;
}

Assistant:

std::ostream &operator<<(std::ostream &ostream, blc::network::Socket &socket) {
	ostream << socket.read();
	return (ostream);
}